

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

void Cgt_ManDetectFanout(Aig_Man_t *pAig,Aig_Obj_t *pObj,int nOdcMax,Vec_Ptr_t *vFanout)

{
  bool bVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  int local_50;
  int local_40;
  int local_3c;
  int iFanout;
  int f;
  int k;
  int i;
  Aig_Obj_t *pFanout;
  Vec_Ptr_t *vFanout_local;
  int nOdcMax_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  local_40 = -1;
  Vec_PtrClear(vFanout);
  Aig_ManIncrementTravId(pAig);
  Cgt_ManDetectFanout_rec(pAig,pObj,nOdcMax,vFanout);
  iFanout = 0;
  f = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(vFanout);
    if (iVar2 <= f) {
      Vec_PtrShrink(vFanout,iFanout);
      Vec_PtrSort(vFanout,Aig_ObjCompareIdIncrease);
      iVar2 = Vec_PtrSize(vFanout);
      if (iVar2 < 1) {
        __assert_fail("Vec_PtrSize(vFanout) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                      ,0x89,"void Cgt_ManDetectFanout(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
      }
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vFanout,f);
    if (pAig->pFanData == (int *)0x0) break;
    local_3c = 0;
    while( true ) {
      bVar1 = false;
      if (local_3c < (int)((uint)(*(ulong *)&pObj_00->field_0x18 >> 6) & 0x3ffffff)) {
        if (local_3c == 0) {
          local_50 = Aig_ObjFanout0Int(pAig,pObj_00->Id);
        }
        else {
          local_50 = Aig_ObjFanoutNext(pAig,local_40);
        }
        local_40 = local_50;
        _k = Aig_ManObj(pAig,local_50 >> 1);
        bVar1 = true;
      }
      if ((!bVar1) || (iVar2 = Aig_ObjIsTravIdCurrent(pAig,_k), iVar2 == 0)) break;
      local_3c = local_3c + 1;
    }
    iVar2 = Aig_ObjRefs(pObj_00);
    if (local_3c != iVar2) {
      Vec_PtrWriteEntry(vFanout,iFanout,pObj_00);
      iFanout = iFanout + 1;
    }
    f = f + 1;
  }
  __assert_fail("pAig->pFanData",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                ,0x80,"void Cgt_ManDetectFanout(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
}

Assistant:

void Cgt_ManDetectFanout( Aig_Man_t * pAig, Aig_Obj_t * pObj, int nOdcMax, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int i, k, f, iFanout = -1;
    // collect visited nodes
    Vec_PtrClear( vFanout );
    Aig_ManIncrementTravId( pAig );
    Cgt_ManDetectFanout_rec( pAig, pObj, nOdcMax, vFanout );
    // remove those nodes whose fanout is included
    k = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
    {
        // go through the fanouts of this node
        Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
            if ( !Aig_ObjIsTravIdCurrent(pAig, pFanout) )
                break;
        if ( f == Aig_ObjRefs(pObj) ) // all fanouts are included
            continue;
        Vec_PtrWriteEntry( vFanout, k++, pObj );
    }
    Vec_PtrShrink( vFanout, k );
    Vec_PtrSort( vFanout, (int (*)(void))Aig_ObjCompareIdIncrease );
    assert( Vec_PtrSize(vFanout) > 0 );
}